

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcStdin.c
# Opt level: O2

void Wlc_NtkReport(Wlc_Ntk_t *p,Abc_Cex_t *pCex,char *pName,int Radix)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int Start;
  int nBits;
  Vec_Str_t *p_01;
  char *pcVar3;
  char *pcVar4;
  int i;
  
  if (pCex->nRegs != 0) {
    __assert_fail("pCex->nRegs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcStdin.c"
                  ,0x72,"void Wlc_NtkReport(Wlc_Ntk_t *, Abc_Cex_t *, char *, int)");
  }
  iVar1 = Abc_NamStrFind(p->pManName,pName);
  if (iVar1 < 1) {
    pcVar4 = "Cannot find \"%s\" among nodes of the network.\n";
  }
  else {
    p_00 = &p->vValues;
    Start = -1;
    i = 0;
    nBits = -1;
    while( true ) {
      iVar2 = (p->vValues).nSize;
      if (iVar2 <= i + 2) break;
      iVar2 = Vec_IntEntry(p_00,i);
      Start = Vec_IntEntry(p_00,i + 1);
      nBits = Vec_IntEntry(p_00,i + 2);
      if (iVar2 == iVar1) {
        iVar2 = (p->vValues).nSize;
        break;
      }
      i = i + 3;
    }
    if (iVar2 != i) {
      if (((uint)Radix < 0x11) && ((0x10404U >> (Radix & 0x1fU) & 1) != 0)) {
        p_01 = Wlc_ConvertToRadix((uint *)(pCex + 1),Start,nBits,Radix);
        pcVar4 = "";
        if (Radix == 2) {
          pcVar4 = "#b";
        }
        pcVar3 = "#x";
        if (Radix != 0x10) {
          pcVar3 = pcVar4;
        }
        printf("((%s %s%s))\n",pName,pcVar3,p_01->pArray);
        Vec_StrFree(p_01);
        return;
      }
      __assert_fail("Radix == 2 || Radix == 10 || Radix == 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcStdin.c"
                    ,0x85,"void Wlc_NtkReport(Wlc_Ntk_t *, Abc_Cex_t *, char *, int)");
    }
    pcVar4 = "Cannot find \"%s\" among primary inputs of the network.\n";
  }
  printf(pcVar4,pName);
  return;
}

Assistant:

void Wlc_NtkReport( Wlc_Ntk_t * p, Abc_Cex_t * pCex, char * pName, int Radix )
{
    Vec_Str_t * vNum;
    int i, NameId, Name, Start = -1, nBits = -1;
    assert( pCex->nRegs == 0 );
    // get the name ID
    NameId = Abc_NamStrFind( p->pManName, pName );
    if ( NameId <= 0 )
    {
        printf( "Cannot find \"%s\" among nodes of the network.\n", pName );
        return;
    }
    // get the primary input
    Vec_IntForEachEntryTriple( &p->vValues, Name, Start, nBits, i )
        if ( Name == NameId )
            break;
    // find the PI
    if ( i == Vec_IntSize(&p->vValues) )
    {
        printf( "Cannot find \"%s\" among primary inputs of the network.\n", pName );
        return;
    }
    // print value
    assert( Radix == 2 || Radix == 10 || Radix == 16 );
    vNum = Wlc_ConvertToRadix( pCex->pData, Start, nBits, Radix );
    printf( "((%s %s%s))\n", pName, Radix == 16 ? "#x" : (Radix == 2 ? "#b" : ""), Vec_StrArray(vNum) );
    Vec_StrFree( vNum );
}